

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateTopKLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  int iVar2;
  pointer pcVar3;
  ActivationLinear *pAVar4;
  bool bVar5;
  LogMessage *pLVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  long lVar9;
  long *plVar10;
  size_type *psVar11;
  Result *_result;
  _Rb_tree_header *p_Var12;
  undefined1 *puVar13;
  string err_1;
  string err;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar5 = Result::good(__return_storage_ptr__);
  if (bVar5) {
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar5) {
      validateOutputCount(__return_storage_ptr__,layer,2,2);
      bVar5 = Result::good(__return_storage_ptr__);
      if (bVar5) {
        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar5) {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"TopK","");
          this_00 = &this->blobNameToRank;
          validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_130,this_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          bVar5 = Result::good(__return_storage_ptr__);
          if (bVar5) {
            pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            if (bVar5) {
              if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
                google::protobuf::internal::LogMessage::LogMessage
                          (&local_110,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                           ,0x358);
                pLVar6 = google::protobuf::internal::LogMessage::operator<<
                                   (&local_110,"CHECK failed: (index) < (current_size_): ");
                google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_188,pLVar6);
                google::protobuf::internal::LogMessage::~LogMessage(&local_110);
              }
              iVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::find(&this_00->_M_t,
                             (key_type *)
                             ((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
              p_Var12 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)iVar7._M_node != p_Var12) {
                if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
                  google::protobuf::internal::LogMessage::LogMessage
                            (&local_d8,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                             ,0x358);
                  pLVar6 = google::protobuf::internal::LogMessage::operator<<
                                     (&local_d8,"CHECK failed: (index) < (current_size_): ");
                  google::protobuf::internal::LogFinisher::operator=
                            ((LogFinisher *)local_188,pLVar6);
                  google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
                }
                iVar7 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::find(&this_00->_M_t,
                               (key_type *)
                               ((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[1]);
                if ((_Rb_tree_header *)iVar7._M_node != p_Var12) {
                  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
                    google::protobuf::internal::LogMessage::LogMessage
                              (&local_a0,LOGLEVEL_DFATAL,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                               ,0x358);
                    pLVar6 = google::protobuf::internal::LogMessage::operator<<
                                       (&local_a0,"CHECK failed: (index) < (current_size_): ");
                    google::protobuf::internal::LogFinisher::operator=
                              ((LogFinisher *)local_188,pLVar6);
                    google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
                  }
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::at(this_00,(key_type *)
                                        ((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements
                                        [0]);
                  iVar2 = *pmVar8;
                  if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
                    google::protobuf::internal::LogMessage::LogMessage
                              (&local_68,LOGLEVEL_DFATAL,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                               ,0x358);
                    pLVar6 = google::protobuf::internal::LogMessage::operator<<
                                       (&local_68,"CHECK failed: (index) < (current_size_): ");
                    google::protobuf::internal::LogFinisher::operator=
                              ((LogFinisher *)local_188,pLVar6);
                    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
                  }
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::at(this_00,(key_type *)
                                        ((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements
                                        [1]);
                  if (iVar2 != *pmVar8) {
                    local_188._8_8_ = (char *)0x0;
                    local_188[0x10] = '\0';
                    plVar10 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
                    lVar9 = *plVar10;
                    local_188._0_8_ = local_188 + 0x10;
                    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_150,lVar9,plVar10[1] + lVar9);
                    std::operator+(&local_1a8,"Layer \'",&local_150);
                    plVar10 = (long *)std::__cxx11::string::append((char *)&local_1a8);
                    psVar11 = (size_type *)(plVar10 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar10 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_1c8.field_2._M_allocated_capacity = *psVar11;
                      local_1c8.field_2._8_8_ = plVar10[3];
                      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                    }
                    else {
                      local_1c8.field_2._M_allocated_capacity = *psVar11;
                      local_1c8._M_dataplus._M_p = (pointer)*plVar10;
                    }
                    local_1c8._M_string_length = plVar10[1];
                    *plVar10 = (long)psVar11;
                    plVar10[1] = 0;
                    *(undefined1 *)(plVar10 + 2) = 0;
                    std::__cxx11::string::operator=((string *)local_188,(string *)&local_1c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                      operator_delete(local_1c8._M_dataplus._M_p,
                                      local_1c8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                      operator_delete(local_1a8._M_dataplus._M_p,
                                      local_1a8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_150._M_dataplus._M_p != &local_150.field_2) {
                      operator_delete(local_150._M_dataplus._M_p,
                                      local_150.field_2._M_allocated_capacity + 1);
                    }
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                   (string *)local_188);
                    if ((undefined1 *)local_188._0_8_ == local_188 + 0x10) {
                      return __return_storage_ptr__;
                    }
                    operator_delete((void *)local_188._0_8_,
                                    CONCAT71(local_188._17_7_,local_188[0x10]) + 1);
                    return __return_storage_ptr__;
                  }
                }
              }
              if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
                if (layer->_oneof_case_[0] == 0x3f7) {
                  puVar13 = *(undefined1 **)&layer->layer_;
                }
                else {
                  puVar13 = Specification::_TopKLayerParams_default_instance_;
                }
                if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
                  google::protobuf::internal::LogMessage::LogMessage
                            ((LogMessage *)local_188,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                             ,0x358);
                  pLVar6 = google::protobuf::internal::LogMessage::operator<<
                                     ((LogMessage *)local_188,
                                      "CHECK failed: (index) < (current_size_): ");
                  google::protobuf::internal::LogFinisher::operator=
                            ((LogFinisher *)&local_1c8,pLVar6);
                  google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_188);
                }
                lVar9 = (long)*(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)
                                             ->elements[0] + 0x24);
                pAVar4 = (((ActivationParams *)puVar13)->NonlinearityType_).linear_;
                bVar5 = SBORROW8((long)pAVar4,-lVar9) !=
                        (long)&(pAVar4->super_MessageLite)._vptr_MessageLite + lVar9 < 0;
                if (lVar9 <= (long)pAVar4 || bVar5) {
                  std::operator+(&local_1a8,
                                 "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'"
                                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
                  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1a8);
                  psVar11 = (size_type *)(plVar10 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar11) {
                    local_1c8.field_2._M_allocated_capacity = *psVar11;
                    local_1c8.field_2._8_8_ = plVar10[3];
                    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                  }
                  else {
                    local_1c8.field_2._M_allocated_capacity = *psVar11;
                    local_1c8._M_dataplus._M_p = (pointer)*plVar10;
                  }
                  local_1c8._M_string_length = plVar10[1];
                  *plVar10 = (long)psVar11;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                    operator_delete(local_1a8._M_dataplus._M_p,
                                    local_1a8.field_2._M_allocated_capacity + 1);
                  }
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                    operator_delete(local_1c8._M_dataplus._M_p,
                                    local_1c8.field_2._M_allocated_capacity + 1);
                  }
                  if (lVar9 <= (long)pAVar4 || bVar5) {
                    return __return_storage_ptr__;
                  }
                }
              }
              Result::Result(__return_storage_ptr__);
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateTopKLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "TopK", blobNameToRank));

    if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
        blobNameToRank.find(layer.output(1)) != blobNameToRank.end()) {
        if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.output(1))) {
            std::string err;
            err = "Layer '" + std::string(layer.name()) + "' of type 'TopK' expects equal ranks for its input and second output, but they are not equal.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.topk();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}